

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::GenerateEnumAssignment
               (string *prefix,EnumDescriptor *en,Printer *printer)

{
  Printer *this;
  string *psVar1;
  string local_40;
  Printer *local_20;
  Printer *printer_local;
  EnumDescriptor *en_local;
  string *prefix_local;
  
  local_20 = printer;
  printer_local = (Printer *)en;
  en_local = (EnumDescriptor *)prefix;
  psVar1 = EnumDescriptor::name_abi_cxx11_(en);
  RubifyConstant(&local_40,psVar1);
  io::Printer::Print(printer,"$prefix$$name$ = ","prefix",prefix,"name",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this = local_20;
  psVar1 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)printer_local);
  io::Printer::Print(this,
                     "Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").enummodule\n"
                     ,"full_name",psVar1);
  return;
}

Assistant:

void GenerateEnumAssignment(
    const std::string& prefix,
    const google::protobuf::EnumDescriptor* en,
    google::protobuf::io::Printer* printer) {
  printer->Print(
    "$prefix$$name$ = ",
    "prefix", prefix,
    "name", RubifyConstant(en->name()));
  printer->Print(
    "Google::Protobuf::DescriptorPool.generated_pool."
    "lookup(\"$full_name$\").enummodule\n",
    "full_name", en->full_name());
}